

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_certificate.cc
# Opt level: O3

bool __thiscall
bssl::ParseTbsCertificate
          (bssl *this,Input tbs_tlv,ParseCertificateOptions *options,ParsedTbsCertificate *out,
          CertErrors *errors)

{
  bool bVar1;
  GeneralizedTime *not_before;
  size_t extraout_RDX;
  char *pcVar2;
  ParsedTbsCertificate *not_after;
  Input input;
  Input value;
  Input validity_tlv_00;
  Input input_00;
  Input in;
  Input in_00;
  Parser tbs_parser;
  Parser parser_1;
  optional<bssl::der::Input> issuer_unique_id;
  Input validity_tlv;
  optional<bssl::der::Input> subject_unique_id;
  optional<bssl::der::Input> version;
  Parser parser;
  CertErrors unused_errors;
  Parser PStack_f8;
  _Storage<bssl::der::BitString,_true> local_e0;
  undefined8 uStack_c8;
  _Storage<bssl::der::Input,_true> local_c0;
  char local_b0;
  Input local_a8;
  _Storage<bssl::der::Input,_true> local_90;
  char local_80;
  _Storage<bssl::der::Input,_true> local_78;
  char local_68;
  Parser local_60;
  
  not_after = out;
  CertErrors::CertErrors((CertErrors *)&stack0xffffffffffffffb8);
  if (out == (ParsedTbsCertificate *)0x0) {
    out = (ParsedTbsCertificate *)&stack0xffffffffffffffb8;
  }
  input.data_.size_ = (size_t)tbs_tlv.data_.data_;
  input.data_.data_ = (uchar *)this;
  der::Parser::Parser(&local_60,input);
  der::Parser::Parser(&PStack_f8);
  bVar1 = der::Parser::ReadSequence(&local_60,&PStack_f8);
  if (bVar1) {
    local_68 = '\0';
    bVar1 = der::Parser::ReadOptionalTag
                      (&PStack_f8,0xa0000000,(optional<bssl::der::Input> *)&local_78._M_value);
    if (bVar1) {
      if (local_68 == '\x01') {
        der::Parser::Parser((Parser *)&local_e0._M_value,local_78._M_value);
        bVar1 = der::Parser::ReadUint64((Parser *)&local_e0._M_value,(uint64_t *)&local_c0);
        if ((bVar1) && (local_c0._M_value.data_.data_ < (der *)0x3)) {
          *(int *)options = (int)local_c0._M_value.data_.data_;
          bVar1 = der::Parser::HasMore((Parser *)&local_e0._M_value);
          if (!bVar1) {
            if (*(int *)options == 0) {
              pcVar2 = "Version explicitly V1 (should be omitted)";
              goto LAB_004a5c9f;
            }
            goto LAB_004a5a68;
          }
        }
        pcVar2 = "Failed parsing version";
      }
      else {
        *(undefined4 *)options = 0;
LAB_004a5a68:
        bVar1 = der::Parser::ReadTag(&PStack_f8,2,(Input *)(options + 8));
        if (bVar1) {
          value.data_.size_._0_1_ = *(char *)tbs_tlv.data_.size_;
          value.data_.data_ = (uchar *)*(undefined8 *)(options + 0x10);
          value.data_.size_._1_7_ = 0;
          bVar1 = VerifySerialNumber(*(bssl **)(options + 8),value,SUB81(out,0),
                                     (CertErrors *)not_after);
          if ((!bVar1) && (*(char *)tbs_tlv.data_.size_ != '\x01')) goto LAB_004a5ca7;
          bVar1 = anon_unknown_0::ReadSequenceTLV(&PStack_f8,(Input *)(options + 0x18));
          if (bVar1) {
            bVar1 = anon_unknown_0::ReadSequenceTLV(&PStack_f8,(Input *)(options + 0x28));
            if (bVar1) {
              local_a8.data_.data_ = (uchar *)0x0;
              local_a8.data_.size_ = 0;
              bVar1 = der::Parser::ReadRawTLV(&PStack_f8,&local_a8);
              if (bVar1) {
                not_before = (GeneralizedTime *)(options + 0x40);
                validity_tlv_00.data_.size_ = (size_t)(options + 0x38);
                validity_tlv_00.data_.data_ = (uchar *)local_a8.data_.size_;
                bVar1 = ParseValidity((bssl *)local_a8.data_.data_,validity_tlv_00,not_before,
                                      (GeneralizedTime *)not_after);
                if (bVar1) {
                  bVar1 = anon_unknown_0::ReadSequenceTLV(&PStack_f8,(Input *)(options + 0x48));
                  if (bVar1) {
                    bVar1 = anon_unknown_0::ReadSequenceTLV(&PStack_f8,(Input *)(options + 0x58));
                    if (bVar1) {
                      local_b0 = '\0';
                      bVar1 = der::Parser::ReadOptionalTag
                                        (&PStack_f8,0x80000001,
                                         (optional<bssl::der::Input> *)&local_c0._M_value);
                      if (bVar1) {
                        if (local_b0 != '\x01') {
LAB_004a5b96:
                          local_80 = '\0';
                          bVar1 = der::Parser::ReadOptionalTag
                                            (&PStack_f8,0x80000002,
                                             (optional<bssl::der::Input> *)&local_90._M_value);
                          if (bVar1) {
                            if (local_80 == '\x01') {
                              in_00.data_.size_ = (size_t)not_before;
                              in_00.data_.data_ = (uchar *)local_90._M_value.data_.size_;
                              der::ParseBitString((optional<bssl::der::BitString> *)
                                                  &local_e0._M_value,
                                                  (der *)local_90._M_value.data_.data_,in_00);
                              *(undefined8 *)(options + 0x98) = local_e0._16_8_;
                              *(undefined8 *)(options + 0xa0) = uStack_c8;
                              *(uchar **)(options + 0x88) = local_e0._M_value.bytes_.data_.data_;
                              *(size_t *)(options + 0x90) = local_e0._M_value.bytes_.data_.size_;
                              if (options[0xa0].allow_invalid_serial_numbers == false) {
                                pcVar2 = "Failed parsing subjectUniqueId";
                              }
                              else {
                                if (*(int *)options - 1U < 2) goto LAB_004a5c05;
                                pcVar2 = "Unexpected subjectUniqueId (must be V2 or V3 certificate)"
                                ;
                              }
                            }
                            else {
LAB_004a5c05:
                              bVar1 = der::Parser::ReadOptionalTag
                                                (&PStack_f8,0xa0000003,
                                                 (optional<bssl::der::Input> *)(options + 0xa8));
                              pcVar2 = "Failed reading extensions SEQUENCE";
                              if (bVar1) {
                                if (options[0xb8].allow_invalid_serial_numbers == true) {
                                  input_00.data_.size_ = extraout_RDX;
                                  input_00.data_.data_ = *(uchar **)(options + 0xb0);
                                  bVar1 = anon_unknown_0::IsSequenceTLV
                                                    (*(anon_unknown_0 **)(options + 0xa8),input_00);
                                  if (bVar1) {
                                    if (*(int *)options == 2) goto LAB_004a5c57;
                                    pcVar2 = "Unexpected extensions (must be V3 certificate)";
                                  }
                                }
                                else {
LAB_004a5c57:
                                  bVar1 = der::Parser::HasMore(&PStack_f8);
                                  if (!bVar1) {
                                    bVar1 = der::Parser::HasMore(&local_60);
                                    bVar1 = !bVar1;
                                    goto LAB_004a5ca9;
                                  }
                                  pcVar2 = "Unconsumed data inside TBSCertificate";
                                }
                              }
                            }
                          }
                          else {
                            pcVar2 = "Failed reading subjectUniqueId";
                          }
                          CertErrors::AddError((CertErrors *)out,pcVar2);
                          goto LAB_004a5ca7;
                        }
                        in.data_.size_ = (size_t)not_before;
                        in.data_.data_ = (uchar *)local_c0._M_value.data_.size_;
                        der::ParseBitString((optional<bssl::der::BitString> *)&local_e0._M_value,
                                            (der *)local_c0._M_value.data_.data_,in);
                        *(undefined8 *)(options + 0x78) = local_e0._16_8_;
                        *(undefined8 *)(options + 0x80) = uStack_c8;
                        *(uchar **)(options + 0x68) = local_e0._M_value.bytes_.data_.data_;
                        *(size_t *)(options + 0x70) = local_e0._M_value.bytes_.data_.size_;
                        if (options[0x80].allow_invalid_serial_numbers == false) {
                          pcVar2 = "Failed parsing issuerUniqueId";
                        }
                        else {
                          if (*(int *)options - 1U < 2) goto LAB_004a5b96;
                          pcVar2 = "Unexpected issuerUniqueId (must be V2 or V3 certificate)";
                        }
                      }
                      else {
                        pcVar2 = "Failed reading issuerUniqueId";
                      }
                      CertErrors::AddError((CertErrors *)out,pcVar2);
                      goto LAB_004a5ca7;
                    }
                    pcVar2 = "Failed reading subjectPublicKeyInfo";
                  }
                  else {
                    pcVar2 = "Failed reading subject";
                  }
                }
                else {
                  pcVar2 = "Failed parsing validity";
                }
              }
              else {
                pcVar2 = "Failed reading validity";
              }
              CertErrors::AddError((CertErrors *)out,pcVar2);
              goto LAB_004a5ca7;
            }
            pcVar2 = "Failed reading issuer";
          }
          else {
            pcVar2 = "Failed reading signature";
          }
        }
        else {
          pcVar2 = "Failed reading serialNumber";
        }
      }
    }
    else {
      pcVar2 = "Failed reading version";
    }
LAB_004a5c9f:
    CertErrors::AddError((CertErrors *)out,pcVar2);
  }
  else {
    CertErrors::AddError((CertErrors *)out,"Failed parsing TBSCertificate SEQUENCE");
  }
LAB_004a5ca7:
  bVar1 = false;
LAB_004a5ca9:
  CertErrors::~CertErrors((CertErrors *)&stack0xffffffffffffffb8);
  return bVar1;
}

Assistant:

bool ParseTbsCertificate(der::Input tbs_tlv,
                         const ParseCertificateOptions &options,
                         ParsedTbsCertificate *out, CertErrors *errors) {
  // The rest of this function assumes that |errors| is non-null.
  CertErrors unused_errors;
  if (!errors) {
    errors = &unused_errors;
  }

  // TODO(crbug.com/634443): Add useful error information to |errors|.

  der::Parser parser(tbs_tlv);

  //   TBSCertificate  ::=  SEQUENCE  {
  der::Parser tbs_parser;
  if (!parser.ReadSequence(&tbs_parser)) {
    errors->AddError(kTbsNotSequence);
    return false;
  }

  //        version         [0]  EXPLICIT Version DEFAULT v1,
  std::optional<der::Input> version;
  if (!tbs_parser.ReadOptionalTag(
          CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 0, &version)) {
    errors->AddError(kFailedReadingVersion);
    return false;
  }
  if (version) {
    if (!ParseVersion(version.value(), &out->version)) {
      errors->AddError(kFailedParsingVersion);
      return false;
    }
    if (out->version == CertificateVersion::V1) {
      errors->AddError(kVersionExplicitlyV1);
      // The correct way to specify v1 is to omit the version field since v1 is
      // the DEFAULT.
      return false;
    }
  } else {
    out->version = CertificateVersion::V1;
  }

  //        serialNumber         CertificateSerialNumber,
  if (!tbs_parser.ReadTag(CBS_ASN1_INTEGER, &out->serial_number)) {
    errors->AddError(kFailedReadingSerialNumber);
    return false;
  }
  if (!VerifySerialNumber(out->serial_number,
                          options.allow_invalid_serial_numbers, errors)) {
    // Invalid serial numbers are only considered fatal failures if
    // |!allow_invalid_serial_numbers|.
    if (!options.allow_invalid_serial_numbers) {
      return false;
    }
  }

  //        signature            AlgorithmIdentifier,
  if (!ReadSequenceTLV(&tbs_parser, &out->signature_algorithm_tlv)) {
    errors->AddError(kFailedReadingSignatureValue);
    return false;
  }

  //        issuer               Name,
  if (!ReadSequenceTLV(&tbs_parser, &out->issuer_tlv)) {
    errors->AddError(kFailedReadingIssuer);
    return false;
  }

  //        validity             Validity,
  der::Input validity_tlv;
  if (!tbs_parser.ReadRawTLV(&validity_tlv)) {
    errors->AddError(kFailedReadingValidity);
    return false;
  }
  if (!ParseValidity(validity_tlv, &out->validity_not_before,
                     &out->validity_not_after)) {
    errors->AddError(kFailedParsingValidity);
    return false;
  }

  //        subject              Name,
  if (!ReadSequenceTLV(&tbs_parser, &out->subject_tlv)) {
    errors->AddError(kFailedReadingSubject);
    return false;
  }

  //        subjectPublicKeyInfo SubjectPublicKeyInfo,
  if (!ReadSequenceTLV(&tbs_parser, &out->spki_tlv)) {
    errors->AddError(kFailedReadingSpki);
    return false;
  }

  //        issuerUniqueID  [1]  IMPLICIT UniqueIdentifier OPTIONAL,
  //                             -- If present, version MUST be v2 or v3
  std::optional<der::Input> issuer_unique_id;
  if (!tbs_parser.ReadOptionalTag(CBS_ASN1_CONTEXT_SPECIFIC | 1,
                                  &issuer_unique_id)) {
    errors->AddError(kFailedReadingIssuerUniqueId);
    return false;
  }
  if (issuer_unique_id) {
    out->issuer_unique_id = der::ParseBitString(issuer_unique_id.value());
    if (!out->issuer_unique_id) {
      errors->AddError(kFailedParsingIssuerUniqueId);
      return false;
    }
    if (out->version != CertificateVersion::V2 &&
        out->version != CertificateVersion::V3) {
      errors->AddError(kIssuerUniqueIdNotExpected);
      return false;
    }
  }

  //        subjectUniqueID [2]  IMPLICIT UniqueIdentifier OPTIONAL,
  //                             -- If present, version MUST be v2 or v3
  std::optional<der::Input> subject_unique_id;
  if (!tbs_parser.ReadOptionalTag(CBS_ASN1_CONTEXT_SPECIFIC | 2,
                                  &subject_unique_id)) {
    errors->AddError(kFailedReadingSubjectUniqueId);
    return false;
  }
  if (subject_unique_id) {
    out->subject_unique_id = der::ParseBitString(subject_unique_id.value());
    if (!out->subject_unique_id) {
      errors->AddError(kFailedParsingSubjectUniqueId);
      return false;
    }
    if (out->version != CertificateVersion::V2 &&
        out->version != CertificateVersion::V3) {
      errors->AddError(kSubjectUniqueIdNotExpected);
      return false;
    }
  }

  //        extensions      [3]  EXPLICIT Extensions OPTIONAL
  //                             -- If present, version MUST be v3
  if (!tbs_parser.ReadOptionalTag(
          CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 3,
          &out->extensions_tlv)) {
    errors->AddError(kFailedReadingExtensions);
    return false;
  }
  if (out->extensions_tlv) {
    // extensions_tlv must be a single element. Also check that it is a
    // SEQUENCE.
    if (!IsSequenceTLV(out->extensions_tlv.value())) {
      errors->AddError(kFailedReadingExtensions);
      return false;
    }
    if (out->version != CertificateVersion::V3) {
      errors->AddError(kUnexpectedExtensions);
      return false;
    }
  }

  // Note that there IS an extension point at the end of TBSCertificate
  // (according to RFC 5912), so from that interpretation, unconsumed data would
  // be allowed in |tbs_parser|.
  //
  // However because only v1, v2, and v3 certificates are supported by the
  // parsing, there shouldn't be any subsequent data in those versions, so
  // reject.
  if (tbs_parser.HasMore()) {
    errors->AddError(kUnconsumedDataInsideTbsCertificateSequence);
    return false;
  }

  // By definition the input was a single TBSCertificate, so there shouldn't be
  // unconsumed data.
  if (parser.HasMore()) {
    return false;
  }

  return true;
}